

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

void __thiscall gui::Slider::updateThumb(Slider *this,float thumbPosition)

{
  float *pfVar1;
  Slider *in_RDI;
  float in_XMM0_Da;
  double dVar2;
  float numThumbPositions;
  float thumbNormalized;
  float thumbWidth;
  float in_stack_ffffffffffffffcc;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_c = in_XMM0_Da;
  local_10 = getThumbWidth(in_RDI);
  local_18 = (local_10 * -0.5 + local_c) / ((in_RDI->size_).x - local_10);
  local_1c = 0.0;
  pfVar1 = std::max<float>(&local_18,&local_1c);
  local_20 = 1.0;
  pfVar1 = std::min<float>(pfVar1,&local_20);
  local_14 = *pfVar1;
  if ((in_RDI->step_ != 0.0) || (NAN(in_RDI->step_))) {
    dVar2 = std::floor((double)(ulong)(uint)(((in_RDI->range_).second - (in_RDI->range_).first) /
                                            in_RDI->step_));
    std::round((double)(ulong)(uint)(local_14 * ((SUB84(dVar2,0) + 1.0) - 1.0)));
    setValue(in_RDI,in_stack_ffffffffffffffcc);
  }
  else {
    setValue(in_RDI,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void Slider::updateThumb(float thumbPosition) {
    const float thumbWidth = getThumbWidth();
    const float thumbNormalized = std::min(std::max((thumbPosition - 0.5f * thumbWidth) / (size_.x - thumbWidth), 0.0f), 1.0f);

    if (step_ == 0.0f) {
        setValue((range_.second - range_.first) * thumbNormalized + range_.first);
    } else {
        float numThumbPositions = std::floor((range_.second - range_.first) / step_) + 1.0f;
        setValue(std::round(thumbNormalized * (numThumbPositions - 1.0f)) * step_ + range_.first);
    }
}